

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O3

int __thiscall Emulator::run(Emulator *this)

{
  pointer pcVar1;
  Console *this_00;
  pointer *__ptr;
  long *local_48;
  id local_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  isRunning = '\x01';
  this_00 = Console::Instance();
  pcVar1 = (this->filename)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (this->filename)._M_string_length);
  Console::init(this_00,(EVP_PKEY_CTX *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  local_40._M_thread = 0;
  local_48 = (long *)operator_new(0x10);
  *local_48 = (long)&PTR___State_0011ea58;
  std::thread::_M_start_thread(&local_40,&local_48,0);
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  if (thread._M_id._M_thread == 0) {
    thread._M_id._M_thread = (id)(id)local_40._M_thread;
    if (isRunning == '\x01') {
      do {
        mainLoopStep();
        SDL_Delay(3);
      } while (isRunning != '\0');
    }
    return 0;
  }
  std::terminate();
}

Assistant:

int Emulator::run() {
    isRunning = true;
    Console &c = Console::Instance();
    c.init(filename);
    thread = std::thread([&]() { mainLoop(); });
#ifdef __EMSCRIPTEN__
    emscripten_set_keydown_callback(EMSCRIPTEN_EVENT_TARGET_WINDOW, c.getController(), true, keyCallback);
    emscripten_set_keyup_callback(EMSCRIPTEN_EVENT_TARGET_WINDOW, c.getController(), true, keyCallback);
    emscripten_set_main_loop(mainLoopStep, 0, 1);
#else
    while(isRunning) {
        mainLoopStep();
        SDL_Delay(idealFrameTime / 5);
    }
#endif
    return 0;
}